

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_create_local_dir_header
                  (mz_zip_archive *pZip,mz_uint8 *pDst,mz_uint16 filename_size,mz_uint16 extra_size,
                  mz_uint64 uncomp_size,mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,
                  mz_uint16 bit_flags,mz_uint16 dos_time,mz_uint16 dos_date)

{
  ulong uVar1;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  undefined1 uVar2;
  ulong uVar3;
  
  uVar3 = CONCAT62(in_register_00000012,filename_size) & 0xffffffff;
  pZip->m_archive_size = 0;
  pZip->m_central_directory_file_ofs = 0;
  *(undefined8 *)((long)&pZip->m_central_directory_file_ofs + 6) = 0;
  *(undefined8 *)((long)&pZip->m_zip_mode + 2) = 0;
  *(undefined4 *)&pZip->m_archive_size = 0x4034b50;
  uVar2 = 0x14;
  if ((short)uncomp_crc32 == 0) {
    uVar2 = 0;
  }
  *(undefined1 *)((long)&pZip->m_archive_size + 4) = uVar2;
  *(undefined1 *)((long)&pZip->m_archive_size + 5) = 0;
  *(mz_uint16 *)((long)&pZip->m_archive_size + 6) = method;
  *(char *)&pZip->m_central_directory_file_ofs = (char)uncomp_crc32;
  *(char *)((long)&pZip->m_central_directory_file_ofs + 1) = (char)(uncomp_crc32 >> 8);
  *(mz_uint16 *)((long)&pZip->m_central_directory_file_ofs + 2) = bit_flags;
  *(mz_uint16 *)((long)&pZip->m_central_directory_file_ofs + 4) = dos_time;
  *(char *)((long)&pZip->m_central_directory_file_ofs + 6) = (char)(comp_size & 0xffffffff);
  *(char *)((long)&pZip->m_central_directory_file_ofs + 7) = (char)((comp_size & 0xffffffff) >> 8);
  *(char *)&pZip->m_total_files = (char)(comp_size >> 0x10);
  *(char *)((long)&pZip->m_total_files + 1) = (char)(comp_size >> 0x18);
  if (0xfffffffe < uncomp_size) {
    uncomp_size = 0xffffffff;
  }
  *(char *)((long)&pZip->m_total_files + 2) = (char)uncomp_size;
  *(char *)((long)&pZip->m_total_files + 3) = (char)(uncomp_size >> 8);
  *(char *)&pZip->m_zip_mode = (char)(uncomp_size >> 0x10);
  uVar1 = 0xffffffff;
  if (CONCAT62(in_register_0000000a,extra_size) < 0xffffffff) {
    uVar1 = CONCAT62(in_register_0000000a,extra_size);
  }
  *(byte *)((long)&pZip->m_zip_mode + 1) = (byte)(uncomp_size >> 0x18);
  *(byte *)((long)&pZip->m_zip_mode + 2) = (byte)uVar1;
  *(byte *)((long)&pZip->m_zip_mode + 3) = (byte)(uVar1 >> 8);
  *(char *)&pZip->m_zip_type = (char)(uVar1 >> 0x10);
  *(byte *)((long)&pZip->m_zip_type + 1) = (byte)(uVar1 >> 0x18);
  *(byte *)((long)&pZip->m_zip_type + 2) = (byte)((ulong)pDst & 0xffffffff);
  *(byte *)((long)&pZip->m_zip_type + 3) = (byte)(((ulong)pDst & 0xffffffff) >> 8);
  *(char *)&pZip->m_last_error = (char)uVar3;
  *(byte *)((long)&pZip->m_last_error + 1) = (byte)(uVar3 >> 8);
  return (mz_bool)CONCAT62(in_register_00000012,filename_size);
}

Assistant:

static mz_bool mz_zip_writer_create_local_dir_header(
    mz_zip_archive *pZip, mz_uint8 *pDst, mz_uint16 filename_size,
    mz_uint16 extra_size, mz_uint64 uncomp_size, mz_uint64 comp_size,
    mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags,
    mz_uint16 dos_time, mz_uint16 dos_date) {
  (void)pZip;
  memset(pDst, 0, MZ_ZIP_LOCAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_SIG_OFS, MZ_ZIP_LOCAL_DIR_HEADER_SIG);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_VERSION_NEEDED_OFS, method ? 20 : 0);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_BIT_FLAG_OFS, bit_flags);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_METHOD_OFS, method);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILE_TIME_OFS, dos_time);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILE_DATE_OFS, dos_date);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_CRC32_OFS, uncomp_crc32);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS,
                MZ_MIN(comp_size, MZ_UINT32_MAX));
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS,
                MZ_MIN(uncomp_size, MZ_UINT32_MAX));
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILENAME_LEN_OFS, filename_size);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_EXTRA_LEN_OFS, extra_size);
  return MZ_TRUE;
}